

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

char * get_cpu_name(void)

{
  FILE *__stream;
  char *pcVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  
  __stream = fopen("/proc/cpuinfo","r");
  pcVar1 = fgets(get_cpu_name::buffer,0x200,__stream);
  pcVar5 = "Unknown";
  while( true ) {
    if (pcVar1 == (char *)0x0) goto LAB_00101b9b;
    pcVar1 = strstr(get_cpu_name::buffer,"model name");
    if ((pcVar1 != (char *)0x0) &&
       (pcVar1 = strchr(get_cpu_name::buffer,0x3a), pcVar1 != (char *)0x0)) break;
    pcVar1 = fgets(get_cpu_name::buffer,0x200,__stream);
  }
  ppuVar2 = __ctype_b_loc();
  pcVar1 = pcVar1 + 1;
  do {
    pcVar5 = pcVar1;
    pcVar1 = pcVar5 + 1;
  } while ((*(byte *)((long)*ppuVar2 + (long)*pcVar5 * 2 + 1) & 0x20) != 0);
  cVar4 = *pcVar1;
  if (cVar4 != '\0') {
    pcVar3 = pcVar5 + 2;
    do {
      if (((*(byte *)((long)*ppuVar2 + (long)cVar4 * 2 + 1) & 0x20) == 0) ||
         ((*(byte *)((long)*ppuVar2 + (long)pcVar1[-1] * 2 + 1) & 0x20) == 0)) {
        *pcVar1 = cVar4;
        pcVar1 = pcVar1 + 1;
      }
      cVar4 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar4 != '\0');
  }
  *pcVar1 = '\0';
LAB_00101b9b:
  fclose(__stream);
  return pcVar5;
}

Assistant:

const char *
get_cpu_name (void)
{
	const char *name = "Unknown", *search = NULL ;
	static char buffer [512] ;
	FILE * file = NULL ;
	int is_pipe = 0 ;

#if defined (__linux__)
	file = fopen ("/proc/cpuinfo", "r") ;
	search = "model name" ;
#elif defined (__APPLE__)
	file = popen ("/usr/sbin/system_profiler -detailLevel full SPHardwareDataType", "r") ;
	search = "Processor Name" ;
	is_pipe = 1 ;
#elif defined (__FreeBSD__) || defined (__OpenBSD__)
	file = popen ("sysctl -a", "r") ;
	search = "hw.model" ;
	is_pipe = 1 ;
#else
	(void) search ;
	(void) buffer ;
	(void) file ;
	(void) is_pipe ;

	return name;
#endif

#if defined (__linux__) || defined (__APPLE__) || defined (__FreeBSD__) || defined (__OpenBSD__)
	if (search == NULL)
	{	printf ("Error : search is NULL in function %s.\n", __func__) ;
		return name ;
		} ;

	while (fgets (buffer, sizeof (buffer), file) != NULL)
		if (strstr (buffer, search))
		{	char *src, *dest ;

			if ((src = strchr (buffer, ':')) != NULL)
			{	src ++ ;
				while (isspace (src [0]))
					src ++ ;
				name = src ;

				/* Remove consecutive spaces. */
				src ++ ;
				for (dest = src ; src [0] ; src ++)
				{	if (isspace (src [0]) && isspace (dest [-1]))
						continue ;
					dest [0] = src [0] ;
					dest ++ ;
					} ;
				dest [0] = 0 ;
				break ;
				} ;
			} ;

	if (is_pipe)
		pclose (file) ;
	else
		fclose (file) ;

	return name ;
#endif
}